

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::TexSubImage2DArrayDepthCase::createTexture
          (TexSubImage2DArrayDepthCase *this)

{
  ContextWrapper *this_00;
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  TransferFormat TVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int depth;
  deUint32 tex;
  ContextWrapper *local_c8;
  ulong local_c0;
  TransferFormat local_b8;
  Vec4 gMax;
  Vec4 gMin;
  TextureLevel levelData;
  PixelBufferAccess local_68;
  Random rnd;
  
  TVar7 = glu::getTransferFormat((this->super_Texture2DArraySpecCase).m_texFormat);
  dVar1 = deStringHash((this->super_Texture2DArraySpecCase).super_TextureSpecCase.super_TestCase.
                       super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar1);
  tex = 0;
  local_c0 = (ulong)TVar7 >> 0x20;
  local_b8 = TVar7;
  local_68.super_ConstPixelBufferAccess.m_format =
       glu::mapGLTransferFormat(TVar7.format,TVar7.dataType);
  tcu::TextureLevel::TextureLevel(&levelData,(TextureFormat *)&local_68);
  this_00 = &(this->super_Texture2DArraySpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x8c1a,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  dVar1 = sglr::ContextWrapper::glGetError(this_00);
  glu::checkError(dVar1,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureSpecificationTests.cpp"
                  ,0xc83);
  local_c8 = this_00;
  if (0 < (this->super_Texture2DArraySpecCase).m_numLevels) {
    iVar9 = 0;
    do {
      iVar10 = (this->super_Texture2DArraySpecCase).m_width >> ((byte)iVar9 & 0x1f);
      if (iVar10 < 2) {
        iVar10 = 1;
      }
      iVar13 = (this->super_Texture2DArraySpecCase).m_height >> ((byte)iVar9 & 0x1f);
      if (iVar13 < 2) {
        iVar13 = 1;
      }
      gMin.m_data[0] = -1.5;
      gMin.m_data[1] = -2.0;
      gMin.m_data[2] = 1.7;
      gMin.m_data[3] = -1.5;
      gMax.m_data[0] = 2.0;
      gMax.m_data[1] = 1.5;
      gMax.m_data[2] = -1.0;
      gMax.m_data[3] = 2.0;
      tcu::TextureLevel::setSize
                (&levelData,iVar10,iVar13,(this->super_Texture2DArraySpecCase).m_numLayers);
      tcu::TextureLevel::getAccess(&local_68,&levelData);
      tcu::fillWithComponentGradients(&local_68,&gMin,&gMax);
      iVar12 = (this->super_Texture2DArraySpecCase).m_numLayers;
      dVar1 = this->m_internalFormat;
      tcu::TextureLevel::getAccess(&local_68,&levelData);
      sglr::ContextWrapper::glTexImage3D
                (local_c8,0x8c1a,iVar9,dVar1,iVar10,iVar13,iVar12,0,local_b8.format,
                 (deUint32)local_c0,local_68.super_ConstPixelBufferAccess.m_data);
      iVar9 = iVar9 + 1;
    } while (iVar9 < (this->super_Texture2DArraySpecCase).m_numLevels);
  }
  if (0 < (this->super_Texture2DArraySpecCase).m_numLevels) {
    iVar9 = 0;
    do {
      uVar11 = (this->super_Texture2DArraySpecCase).m_width >> ((byte)iVar9 & 0x1f);
      if ((int)uVar11 < 2) {
        uVar11 = 1;
      }
      uVar8 = (this->super_Texture2DArraySpecCase).m_height >> ((byte)iVar9 & 0x1f);
      if ((int)uVar8 < 2) {
        uVar8 = 1;
      }
      dVar1 = deRandom_getUint32(&rnd.m_rnd);
      dVar2 = deRandom_getUint32(&rnd.m_rnd);
      uVar14 = (this->super_Texture2DArraySpecCase).m_numLayers;
      dVar3 = deRandom_getUint32(&rnd.m_rnd);
      uVar14 = dVar3 % uVar14;
      dVar3 = deRandom_getUint32(&rnd.m_rnd);
      dVar4 = deRandom_getUint32(&rnd.m_rnd);
      iVar10 = (this->super_Texture2DArraySpecCase).m_numLayers;
      dVar5 = deRandom_getUint32(&rnd.m_rnd);
      gMin.m_data[0] = 2.0;
      gMin.m_data[1] = 1.5;
      gMin.m_data[2] = -1.0;
      gMin.m_data[3] = 2.0;
      gMax.m_data[0] = -1.5;
      gMax.m_data[1] = -2.0;
      gMax.m_data[2] = 1.7;
      gMax.m_data[3] = -1.5;
      dVar6 = deRandom_getUint32(&rnd.m_rnd);
      iVar13 = dVar1 % uVar11 + 1;
      iVar12 = dVar2 % uVar8 + 1;
      depth = uVar14 + 1;
      tcu::TextureLevel::setSize(&levelData,iVar13,iVar12,depth);
      tcu::TextureLevel::getAccess(&local_68,&levelData);
      tcu::fillWithGrid(&local_68,dVar6 % 0xf + 2,&gMin,&gMax);
      tcu::TextureLevel::getAccess(&local_68,&levelData);
      sglr::ContextWrapper::glTexSubImage3D
                (local_c8,0x8c1a,iVar9,dVar3 % (uVar11 - dVar1 % uVar11),
                 dVar4 % (uVar8 - dVar2 % uVar8),dVar5 % (iVar10 - uVar14),iVar13,iVar12,depth,
                 local_b8.format,(deUint32)local_c0,local_68.super_ConstPixelBufferAccess.m_data);
      iVar9 = iVar9 + 1;
    } while (iVar9 < (this->super_Texture2DArraySpecCase).m_numLevels);
  }
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void createTexture (void)
	{
		glu::TransferFormat	fmt			= glu::getTransferFormat(m_texFormat);
		de::Random			rnd			(deStringHash(getName()));
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(glu::mapGLTransferFormat(fmt.format, fmt.dataType));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D_ARRAY, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
		GLU_CHECK();

		// First specify full texture.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			const int   levelW		= de::max(1, m_width >> ndx);
			const int   levelH		= de::max(1, m_height >> ndx);
			const Vec4  gMin		= Vec4(-1.5f, -2.0f, 1.7f, -1.5f);
			const Vec4  gMax		= Vec4(2.0f, 1.5f, -1.0f, 2.0f);

			levelData.setSize(levelW, levelH, m_numLayers);
			tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

			glTexImage3D(GL_TEXTURE_2D_ARRAY, ndx, m_internalFormat, levelW, levelH, m_numLayers, 0, fmt.format, fmt.dataType, levelData.getAccess().getDataPtr());
		}

		// Re-specify parts of each level.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			const int	levelW		= de::max(1, m_width >> ndx);
			const int	levelH		= de::max(1, m_height >> ndx);

			const int	w			= rnd.getInt(1, levelW);
			const int	h			= rnd.getInt(1, levelH);
			const int	d			= rnd.getInt(1, m_numLayers);
			const int	x			= rnd.getInt(0, levelW-w);
			const int	y			= rnd.getInt(0, levelH-h);
			const int	z			= rnd.getInt(0, m_numLayers-d);

			const Vec4	colorA		= Vec4(2.0f, 1.5f, -1.0f, 2.0f);
			const Vec4	colorB		= Vec4(-1.5f, -2.0f, 1.7f, -1.5f);
			const int	cellSize	= rnd.getInt(2, 16);

			levelData.setSize(w, h, d);
			tcu::fillWithGrid(levelData.getAccess(), cellSize, colorA, colorB);

			glTexSubImage3D(GL_TEXTURE_2D_ARRAY, ndx, x, y, z, w, h, d, fmt.format, fmt.dataType, levelData.getAccess().getDataPtr());
		}
	}